

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O1

void Fl::get_mouse(int *xx,int *yy)

{
  uint mask;
  int cy;
  int cx;
  int my;
  int mx;
  Window c;
  Window root;
  
  fl_open_display();
  XQueryPointer();
  *xx = mx;
  *yy = my;
  return;
}

Assistant:

void Fl::get_mouse(int &xx, int &yy) {
  fl_open_display();
  Window root = RootWindow(fl_display, fl_screen);
  Window c; int mx,my,cx,cy; unsigned int mask;
  XQueryPointer(fl_display,root,&root,&c,&mx,&my,&cx,&cy,&mask);
  xx = mx;
  yy = my;
}